

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

CheckResult * icu_63::CheckResult::validateThis(USpoofCheckResult *ptr,UErrorCode *status)

{
  UBool UVar1;
  CheckResult *This;
  UErrorCode *status_local;
  USpoofCheckResult *ptr_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (ptr == (USpoofCheckResult *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      ptr_local = (USpoofCheckResult *)0x0;
    }
    else {
      ptr_local = ptr;
      if (*(int *)(ptr + 8) != 0x2734ecde) {
        *status = U_INVALID_FORMAT_ERROR;
        ptr_local = (USpoofCheckResult *)0x0;
      }
    }
  }
  else {
    ptr_local = (USpoofCheckResult *)0x0;
  }
  return (CheckResult *)ptr_local;
}

Assistant:

const CheckResult* CheckResult::validateThis(const USpoofCheckResult *ptr, UErrorCode &status) {
    if (U_FAILURE(status)) { return NULL; }
    if (ptr == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    CheckResult *This = (CheckResult*) ptr;
    if (This->fMagic != USPOOF_CHECK_MAGIC) {
        status = U_INVALID_FORMAT_ERROR;
        return NULL;
    }
    return This;
}